

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleFunctions(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  uint uVar1;
  byte bVar2;
  ByteCode *code;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *pTVar6;
  IntrusiveList<MatchData> generics_00;
  IntrusiveList<TypeHandle> arguments;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  ExprBase *function_00;
  Lexeme *source_00;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  ExternVarInfo *pEVar13;
  ExternFuncInfo *pEVar14;
  ExternLocalInfo *pEVar15;
  SynIdentifier *pSVar16;
  MatchData *pMVar17;
  bool_type bVar18;
  FunctionData *pFVar19;
  NamespaceData **ppNVar20;
  ModuleData **ppMVar21;
  SmallArray<ArgumentData,_4U> *this;
  VariableData *pVVar22;
  TypeClass *this_00;
  DirectChainedMap<FunctionData_*> *this_01;
  TypeHandle *this_02;
  TypeFunction *pTVar23;
  ArgumentData *pAVar24;
  FunctionData **ppFVar25;
  ExprFunctionAccess *pEVar26;
  ExprBase *context;
  ExprFunctionCall *this_03;
  uint uVar27;
  TypeFunction *in_stack_fffffffffffff990;
  undefined4 uVar28;
  TypeBase *local_5b0;
  TypeBase *local_528;
  bool local_4fa;
  SynIdentifier *local_4b8;
  SynBase *local_4a8;
  TypeBase *local_488;
  FunctionData *local_400;
  IntrusiveList<ExprBase> local_3b8;
  ExprFunctionAccess *local_3a8;
  ExprBase *access;
  FunctionData *target;
  ExternLocalInfo *argument_2;
  FunctionData *pFStack_388;
  uint n_2;
  FunctionData *data_1;
  ExternFuncInfo *function_1;
  TypeClass *pTStack_370;
  uint i_1;
  TypeClass *typeClass_1;
  TypeHandle *pTStack_360;
  ExternLocalInfo *local_358;
  ExternLocalInfo *argument_1;
  undefined1 auStack_348 [4];
  uint n_1;
  IntrusiveList<TypeHandle> argTypes;
  TypeBase *returnType;
  VariableData *variable_2;
  SynIdentifier *local_318;
  SynIdentifier *argNameIdentifier_2;
  undefined1 local_308 [4];
  uint offset_2;
  char *local_2f8;
  char *pos;
  TypeClass *typeClass;
  VariableData *variable_1;
  SynIdentifier *local_2d0;
  SynIdentifier *argNameIdentifier_1;
  TypeRef *pTStack_2c0;
  uint offset_1;
  TypeBase *type_2;
  VariableData *variable;
  undefined1 local_2a8 [4];
  uint offset;
  SynIdentifier *local_278;
  char *pcStack_270;
  SynIdentifier *local_260;
  SynIdentifier *argNameIdentifier;
  InplaceStr argName;
  TypeBase *argType;
  bool isExplicit;
  ExternLocalInfo *argument;
  undefined1 local_228 [4];
  uint n;
  InplaceStr local_218;
  InplaceStr local_208;
  MatchData *local_1f8;
  MatchData *pMStack_1f0;
  FunctionData *local_1e0;
  FunctionData *data;
  char *pcStack_1d0;
  TypeBase *local_1c8;
  char *pcStack_1c0;
  SynIdentifier *local_1b0;
  SynIdentifier *identifier;
  Lexeme *locationName;
  SynBase *locationSource;
  ModuleData *importModule;
  bool isOperator;
  bool accessor;
  TypeRef *pTStack_188;
  bool coroutine;
  TypeBase *contextType;
  TypeBase *parentType;
  NamespaceData *pNStack_170;
  uint k_2;
  NamespaceData *parentNamespace;
  TypeBase *local_150;
  TypeBase *type_1;
  TypeBase *prevType;
  uint k_1;
  bool explicitTypeMatch;
  FunctionLookupChain chain;
  FunctionData *prototype;
  FunctionData *prev;
  TypeBase *type;
  char *pcStack_100;
  SynIdentifier *local_f8;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  uint k;
  bool hasGenericExplicitType;
  IntrusiveList<MatchData> generics;
  TypeBase *functionType;
  InplaceStr functionName;
  ExternFuncInfo *function;
  undefined1 local_a0 [4];
  uint i;
  InplaceStr defaultAssignName;
  uint currCount;
  ExternLocalInfo *localList;
  ExternFuncInfo *functionList;
  ExternVarInfo *explicitTypeInfo;
  char *symbols;
  ByteCode *bCode;
  TraceScope traceScope;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar10 = __cxa_guard_acquire(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)
                                    ::token), iVar10 != 0)) {
    ImportModuleFunctions::token = NULLC::TraceGetToken("analyze","ImportModuleFunctions");
    __cxa_guard_release(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bCode,ImportModuleFunctions::token);
  code = moduleCtx->data->bytecode;
  pcVar12 = FindSymbols(code);
  pEVar13 = FindFirstVar(code);
  functionList = (ExternFuncInfo *)(pEVar13 + code->variableCount);
  moduleCtx->data->importedFunctionCount = code->moduleFunctionCount;
  pEVar14 = FindFirstFunc(code);
  pEVar15 = FindFirstLocal(code);
  defaultAssignName.end._4_4_ = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
  InplaceStr::InplaceStr((InplaceStr *)local_a0,"default_assign$_");
  function._4_4_ = 0;
  do {
    if (code->functionCount - code->moduleFunctionCount <= function._4_4_) {
      for (function_1._4_4_ = 0; function_1._4_4_ < code->functionCount - code->moduleFunctionCount;
          function_1._4_4_ = function_1._4_4_ + 1) {
        data_1 = (FunctionData *)(pEVar14 + function_1._4_4_);
        ppFVar25 = SmallArray<FunctionData_*,_128U>::operator[]
                             (&ctx->functions,defaultAssignName.end._4_4_ + function_1._4_4_);
        pFStack_388 = *ppFVar25;
        for (argument_2._4_4_ = 0; argument_2._4_4_ < *(uint *)((long)&(data_1->generics).tail + 4);
            argument_2._4_4_ = argument_2._4_4_ + 1) {
          target = (FunctionData *)(pEVar15 + (*(int *)&(data_1->generics).tail + argument_2._4_4_))
          ;
          if (*(unsigned_short *)((long)&target->source + 2) != 0xffff) {
            ppFVar25 = SmallArray<FunctionData_*,_128U>::operator[]
                                 (&ctx->functions,
                                  (defaultAssignName.end._4_4_ +
                                  *(unsigned_short *)((long)&target->source + 2)) -
                                  code->moduleFunctionCount);
            access = (ExprBase *)*ppFVar25;
            pEVar26 = ExpressionContext::get<ExprFunctionAccess>(ctx);
            function_00 = access;
            pTVar6 = *(TypeBase **)&access->listed;
            context = &ExpressionContext::get<ExprNullptrLiteral>(ctx)->super_ExprBase;
            ExprNullptrLiteral::ExprNullptrLiteral
                      ((ExprNullptrLiteral *)context,source,(TypeBase *)access[1]._vptr_ExprBase);
            ExprFunctionAccess::ExprFunctionAccess
                      (pEVar26,source,pTVar6,(FunctionData *)function_00,context);
            local_3a8 = pEVar26;
            this_03 = ExpressionContext::get<ExprFunctionCall>(ctx);
            pEVar26 = local_3a8;
            pTVar6 = *(TypeBase **)(*(long *)&access->listed + 0x60);
            IntrusiveList<ExprBase>::IntrusiveList(&local_3b8);
            ExprFunctionCall::ExprFunctionCall
                      (this_03,source,pTVar6,&pEVar26->super_ExprBase,local_3b8);
            pAVar24 = SmallArray<ArgumentData,_4U>::operator[]
                                (&pFStack_388->arguments,argument_2._4_4_);
            pAVar24->value = &this_03->super_ExprBase;
          }
        }
      }
      NULLC::TraceScope::~TraceScope((TraceScope *)&bCode);
      return;
    }
    functionName.end = (char *)(pEVar14 + function._4_4_);
    InplaceStr::InplaceStr
              ((InplaceStr *)&functionType,
               pcVar12 + ((ExternFuncInfo *)functionName.end)->offsetToName);
    generics.tail =
         (MatchData *)
         GetImportedModuleTypeAt(ctx,source,moduleCtx,*(uint *)(functionName.end + 0x40));
    if ((TypeBase *)generics.tail == (TypeBase *)0x0) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,source,"ERROR: can\'t find function \'%s\' type in module %.*s",
                 pcVar12 + *(uint *)functionName.end,
                 (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                              (int)(moduleCtx->data->name).begin));
    }
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&k);
    name.end._7_1_ = 0;
    for (name.end._0_4_ = 0; (uint)name.end < *(uint *)(functionName.end + 0x78);
        name.end._0_4_ = (uint)name.end + 1) {
      InplaceStr::InplaceStr
                ((InplaceStr *)&nameIdentifier,
                 pcVar12 + (&functionList->offsetToName)[(ulong)(uint)name.end * 4]);
      pSVar16 = ExpressionContext::get<SynIdentifier>(ctx);
      type = (TypeBase *)nameIdentifier;
      pcStack_100 = name.begin;
      name_03.end = name.begin;
      name_03.begin = (char *)nameIdentifier;
      SynIdentifier::SynIdentifier(pSVar16,name_03);
      local_f8 = pSVar16;
      if ((&functionList->regVmCodeSize)[(ulong)(uint)name.end * 4] == -1) {
        local_400 = (FunctionData *)ctx->typeGeneric;
      }
      else {
        local_400 = (FunctionData *)
                    GetImportedModuleTypeAt
                              (ctx,source,moduleCtx,
                               (&functionList->regVmCodeSize)[(ulong)(uint)name.end * 4]);
      }
      prev = local_400;
      if (local_400 == (FunctionData *)0x0) {
        pcVar3 = (moduleCtx->data->name).begin;
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,
                   "ERROR: can\'t find function \'%s\' explicit type \'%d\' in module %.*s",
                   pcVar12 + *(uint *)functionName.end,(ulong)(uint)name.end,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar3),pcVar3);
      }
      if (((ulong)prev->name & 0x100000000) != 0) {
        name.end._7_1_ = 1;
      }
      pMVar17 = ExpressionContext::get<MatchData>(ctx);
      MatchData::MatchData(pMVar17,local_f8,(TypeBase *)prev);
      IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&k,pMVar17);
    }
    functionList = (ExternFuncInfo *)
                   (&functionList->offsetToName + (ulong)*(uint *)(functionName.end + 0x78) * 4);
    prototype = (FunctionData *)0x0;
    chain.scope = (ScopeData *)0x0;
    anon_unknown.dwarf_e7629::LookupFunctionChainByName
              ((FunctionLookupChain *)&k_1,ctx,*(uint *)(functionName.end + 0x7c));
    while (bVar18 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                              ((FunctionLookupChain *)&k_1), bVar18 != 0) {
      pFVar19 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->
                          ((FunctionLookupChain *)&k_1);
      if ((pFVar19->isPrototype & 1U) == 0) {
        pFVar19 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->
                            ((FunctionLookupChain *)&k_1);
        if (pFVar19->type == (TypeFunction *)generics.tail) {
          prevType._7_1_ = '\x01';
          for (prevType._0_4_ = 0; (uint)prevType < *(uint *)(functionName.end + 0x78);
              prevType._0_4_ = (uint)prevType + 1) {
            pFVar19 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->
                                ((FunctionLookupChain *)&k_1);
            pMVar17 = IntrusiveList<MatchData>::operator[](&pFVar19->generics,(uint)prevType);
            type_1 = pMVar17->type;
            pMVar17 = IntrusiveList<MatchData>::operator[]
                                ((IntrusiveList<MatchData> *)&k,(uint)prevType);
            local_150 = pMVar17->type;
            prevType._7_1_ = '\0';
          }
          if (prevType._7_1_ != '\0') {
            prototype = anon_unknown.dwarf_e7629::FunctionLookupChain::operator*
                                  ((FunctionLookupChain *)&k_1);
            break;
          }
        }
      }
      else {
        chain.scope = (ScopeData *)
                      anon_unknown.dwarf_e7629::FunctionLookupChain::operator*
                                ((FunctionLookupChain *)&k_1);
      }
      anon_unknown.dwarf_e7629::FunctionLookupChain::next
                ((FunctionLookupChain *)&parentNamespace,(FunctionLookupChain *)&k_1);
    }
    if (prototype == (FunctionData *)0x0) {
      pNStack_170 = (NamespaceData *)0x0;
      for (parentType._4_4_ = 0; uVar27 = parentType._4_4_,
          uVar11 = SmallArray<NamespaceData_*,_128U>::size(&ctx->namespaces), uVar27 < uVar11;
          parentType._4_4_ = parentType._4_4_ + 1) {
        ppNVar20 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,parentType._4_4_);
        if ((*ppNVar20)->fullNameHash == *(uint *)(functionName.end + 0x60)) {
          ppNVar20 = SmallArray<NamespaceData_*,_128U>::operator[]
                               (&ctx->namespaces,parentType._4_4_);
          pNStack_170 = *ppNVar20;
          break;
        }
      }
      if (pNStack_170 != (NamespaceData *)0x0) {
        ExpressionContext::PushScope(ctx,pNStack_170);
      }
      contextType = (TypeBase *)0x0;
      if ((*(int *)(functionName.end + 0x48) != -1) &&
         (contextType = GetImportedModuleTypeAt
                                  (ctx,source,moduleCtx,*(uint *)(functionName.end + 0x48)),
         contextType == (TypeBase *)0x0)) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,"ERROR: can\'t find function \'%s\' parent type in module %.*s",
                   pcVar12 + *(uint *)functionName.end,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin));
      }
      pTStack_188 = (TypeRef *)0x0;
      if ((*(int *)(functionName.end + 0x4c) != -1) &&
         (pTStack_188 = (TypeRef *)
                        GetImportedModuleTypeAt
                                  (ctx,source,moduleCtx,*(uint *)(functionName.end + 0x4c)),
         pTStack_188 == (TypeRef *)0x0)) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,"ERROR: can\'t find function \'%s\' context type in module %.*s",
                   pcVar12 + *(uint *)functionName.end,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin));
      }
      if (pTStack_188 == (TypeRef *)0x0) {
        if (contextType == (TypeBase *)0x0) {
          local_488 = ctx->typeVoid;
        }
        else {
          local_488 = contextType;
        }
        pTStack_188 = ExpressionContext::GetReferenceType(ctx,local_488);
      }
      importModule._7_1_ = functionName.end[0x35] == '\x03';
      importModule._6_1_ = functionName.begin[-1] == '$';
      importModule._5_1_ = functionName.end[0x37] != '\0';
      if (contextType != (TypeBase *)0x0) {
        ExpressionContext::PushScope(ctx,contextType);
      }
      locationSource = (SynBase *)moduleCtx->data;
      if (*(int *)(functionName.end + 0x80) != 0) {
        ppMVar21 = SmallArray<ModuleData_*,_32U>::operator[]
                             (&moduleCtx->dependencies,*(int *)(functionName.end + 0x80) - 1);
        locationSource = (SynBase *)*ppMVar21;
      }
      uVar27._0_1_ = locationSource->listed;
      uVar27._1_1_ = locationSource->isInternal;
      uVar27._2_2_ = *(undefined2 *)&locationSource->field_0x3a;
      if (uVar27 <= *(uint *)(functionName.end + 0x88)) {
        __assert_fail("function.definitionLocationStart < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32fe,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      uVar11._0_1_ = locationSource->listed;
      uVar11._1_1_ = locationSource->isInternal;
      uVar11._2_2_ = *(undefined2 *)&locationSource->field_0x3a;
      if (uVar11 <= *(uint *)(functionName.end + 0x8c)) {
        __assert_fail("function.definitionLocationEnd < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32ff,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if ((*(int *)(functionName.end + 0x88) != 0) ||
         (local_4a8 = source, *(int *)(functionName.end + 0x8c) != 0)) {
        local_4a8 = &ExpressionContext::get<SynImportLocation>(ctx)->super_SynBase;
        SynImportLocation::SynImportLocation
                  ((SynImportLocation *)local_4a8,
                   (Lexeme *)
                   (&locationSource->next->_vptr_SynBase +
                   (ulong)*(uint *)(functionName.end + 0x88) * 4),
                   (Lexeme *)
                   (&locationSource->next->_vptr_SynBase +
                   (ulong)*(uint *)(functionName.end + 0x8c) * 4));
      }
      locationName = (Lexeme *)local_4a8;
      uVar1._0_1_ = locationSource->listed;
      uVar1._1_1_ = locationSource->isInternal;
      uVar1._2_2_ = *(undefined2 *)&locationSource->field_0x3a;
      if (uVar1 <= *(uint *)(functionName.end + 0x90)) {
        __assert_fail("function.definitionLocationName < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x3303,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      identifier = (SynIdentifier *)
                   (&locationSource->next->_vptr_SynBase +
                   (ulong)*(uint *)(functionName.end + 0x90) * 4);
      if (*(int *)(functionName.end + 0x90) == 0) {
        local_4b8 = ExpressionContext::get<SynIdentifier>(ctx);
        data = (FunctionData *)functionType;
        pcStack_1d0 = functionName.begin;
        name_01.end = functionName.begin;
        name_01.begin = (char *)functionType;
        SynIdentifier::SynIdentifier(local_4b8,name_01);
      }
      else {
        local_4b8 = ExpressionContext::get<SynIdentifier>(ctx);
        local_1c8 = functionType;
        pcStack_1c0 = functionName.begin;
        name_02.end = functionName.begin;
        name_02.begin = (char *)functionType;
        SynIdentifier::SynIdentifier(local_4b8,(Lexeme *)identifier,(Lexeme *)identifier,name_02);
      }
      local_1b0 = local_4b8;
      pFVar19 = ExpressionContext::get<FunctionData>(ctx);
      bVar8 = importModule._7_1_;
      bVar7 = importModule._6_1_;
      bVar2 = importModule._5_1_;
      source_00 = locationName;
      allocator = ctx->allocator;
      scope = ctx->scope;
      in_stack_fffffffffffff990 = getType<TypeFunction>((TypeBase *)generics.tail);
      local_1f8 = _k;
      pMStack_1f0 = generics.head;
      uVar27 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar27 + 1;
      generics_00.tail = generics.head;
      generics_00.head = _k;
      FunctionData::FunctionData
                (pFVar19,allocator,(SynBase *)source_00,scope,(bool)(bVar8 & 1),(bool)(bVar7 & 1),
                 (bool)(bVar2 & 1),in_stack_fffffffffffff990,&pTStack_188->super_TypeBase,local_1b0,
                 generics_00,uVar27);
      pFVar19->importModule = (ModuleData *)locationSource;
      pFVar19->isPrototype = (*(uint *)(functionName.end + 8) & 0x80000000) != 0;
      local_1e0 = pFVar19;
      if ((bool)(pFVar19->isPrototype & 1U) != ((*(uint *)(functionName.end + 8) & 0x80000000) != 0)
         ) {
        __assert_fail("data->isPrototype == ((function.regVmCodeSize & 0x80000000) != 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x330f,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (chain.scope != (ScopeData *)0x0) {
        *(FunctionData **)&(chain.scope)->unrestricted = pFVar19;
      }
      pFVar19->isGenericInstance = functionName.end[0x36] != '\0';
      pSVar16 = pFVar19->name;
      InplaceStr::InplaceStr(&local_208,"__newS");
      bVar9 = InplaceStr::operator==(&pSVar16->name,&local_208);
      local_4fa = true;
      if (!bVar9) {
        pSVar16 = local_1e0->name;
        InplaceStr::InplaceStr(&local_218,"__newA");
        bVar9 = InplaceStr::operator==(&pSVar16->name,&local_218);
        local_4fa = true;
        if (!bVar9) {
          pSVar16 = local_1e0->name;
          InplaceStr::InplaceStr((InplaceStr *)local_228,"__closeUpvalue");
          local_4fa = InplaceStr::operator==(&pSVar16->name,(InplaceStr *)local_228);
        }
      }
      if (local_4fa != false) {
        local_1e0->isInternal = true;
      }
      if (functionName.end[0x35] == '\x01') {
        local_1e0->isHidden = true;
      }
      local_1e0->attributes = *(uint *)(functionName.end + 0x14);
      ExpressionContext::AddFunction(ctx,local_1e0);
      ExpressionContext::PushScope(ctx,local_1e0);
      local_1e0->functionScope = ctx->scope;
      for (argument._4_4_ = 0; uVar28 = (undefined4)((ulong)in_stack_fffffffffffff990 >> 0x20),
          argument._4_4_ < *(uint *)(functionName.end + 0x54); argument._4_4_ = argument._4_4_ + 1)
      {
        uVar27 = *(int *)(functionName.end + 0x50) + argument._4_4_;
        bVar2 = pEVar15[uVar27].paramFlags;
        if (pEVar15[uVar27].type == 0xffffffff) {
          local_528 = ctx->typeGeneric;
        }
        else {
          local_528 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar15[uVar27].type);
        }
        argName.end = (char *)local_528;
        if (local_528 == (TypeBase *)0x0) {
          pcVar3 = (moduleCtx->data->name).begin;
          anon_unknown.dwarf_e7629::Stop
                    (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                     (ulong)(argument._4_4_ + 1),pcVar12 + *(uint *)functionName.end,
                     (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar3),pcVar3);
        }
        InplaceStr::InplaceStr
                  ((InplaceStr *)&argNameIdentifier,pcVar12 + pEVar15[uVar27].offsetToName);
        pSVar16 = ExpressionContext::get<SynIdentifier>(ctx);
        local_278 = argNameIdentifier;
        pcStack_270 = argName.begin;
        name_00.end = argName.begin;
        name_00.begin = (char *)argNameIdentifier;
        SynIdentifier::SynIdentifier(pSVar16,name_00);
        this = &local_1e0->arguments;
        local_260 = pSVar16;
        ArgumentData::ArgumentData
                  ((ArgumentData *)local_2a8,source,(bVar2 & 1) != 0,pSVar16,(TypeBase *)argName.end
                   ,(ExprBase *)0x0);
        SmallArray<ArgumentData,_4U>::push_back(this,(ArgumentData *)local_2a8);
        variable._4_4_ =
             anon_unknown.dwarf_e7629::AllocateArgumentInScope(ctx,source,0,(TypeBase *)argName.end)
        ;
        pVVar22 = ExpressionContext::get<VariableData>(ctx);
        uVar27 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar27 + 1;
        in_stack_fffffffffffff990 = (TypeFunction *)CONCAT44(uVar28,variable._4_4_);
        VariableData::VariableData
                  (pVVar22,ctx->allocator,source,ctx->scope,0,(TypeBase *)argName.end,local_260,
                   variable._4_4_,uVar27);
        type_2 = (TypeBase *)pVVar22;
        ExpressionContext::AddVariable(ctx,pVVar22,true);
      }
      if (pTStack_188 == (TypeRef *)0x0) {
        __assert_fail("contextType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x333c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (contextType == (TypeBase *)0x0) {
        if (pTStack_188 != (TypeRef *)0x0) {
          argNameIdentifier_2._4_4_ =
               anon_unknown.dwarf_e7629::AllocateArgumentInScope
                         (ctx,source,0,&pTStack_188->super_TypeBase);
          pSVar16 = ExpressionContext::get<SynIdentifier>(ctx);
          InplaceStr::InplaceStr((InplaceStr *)&variable_2,"$context");
          SynIdentifier::SynIdentifier(pSVar16,_variable_2);
          local_318 = pSVar16;
          pVVar22 = ExpressionContext::get<VariableData>(ctx);
          uVar27 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar27 + 1;
          in_stack_fffffffffffff990 = (TypeFunction *)CONCAT44(uVar28,argNameIdentifier_2._4_4_);
          VariableData::VariableData
                    (pVVar22,ctx->allocator,source,ctx->scope,0,&pTStack_188->super_TypeBase,
                     local_318,argNameIdentifier_2._4_4_,uVar27);
          ExpressionContext::AddVariable(ctx,pVVar22,false);
        }
      }
      else {
        pTStack_2c0 = ExpressionContext::GetReferenceType(ctx,contextType);
        argNameIdentifier_1._4_4_ =
             anon_unknown.dwarf_e7629::AllocateArgumentInScope
                       (ctx,source,0,&pTStack_2c0->super_TypeBase);
        pSVar16 = ExpressionContext::get<SynIdentifier>(ctx);
        InplaceStr::InplaceStr((InplaceStr *)&variable_1,"this");
        SynIdentifier::SynIdentifier(pSVar16,_variable_1);
        local_2d0 = pSVar16;
        this_00 = (TypeClass *)ExpressionContext::get<VariableData>(ctx);
        uVar27 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar27 + 1;
        in_stack_fffffffffffff990 = (TypeFunction *)CONCAT44(uVar28,argNameIdentifier_1._4_4_);
        VariableData::VariableData
                  ((VariableData *)this_00,ctx->allocator,source,ctx->scope,0,
                   &pTStack_2c0->super_TypeBase,local_2d0,argNameIdentifier_1._4_4_,uVar27);
        typeClass = this_00;
        ExpressionContext::AddVariable(ctx,(VariableData *)this_00,true);
        pos = (char *)getType<TypeClass>(contextType);
        if (((TypeClass *)pos != (TypeClass *)0x0) &&
           (local_2f8 = strstr((local_1e0->name->name).begin,"::"), local_2f8 != (char *)0x0)) {
          SmallArray<FunctionData_*,_4U>::push_back
                    ((SmallArray<FunctionData_*,_4U> *)(pos + 0x130),&local_1e0);
          this_01 = (DirectChainedMap<FunctionData_*> *)(pos + 0x168);
          InplaceStr::InplaceStr((InplaceStr *)local_308,local_2f8 + 2);
          uVar27 = InplaceStr::hash((InplaceStr *)local_308);
          DirectChainedMap<FunctionData_*>::insert(this_01,uVar27,local_1e0);
        }
      }
      local_1e0->argumentsSize = local_1e0->functionScope->dataSize;
      if ((((*(int *)(functionName.end + 0x40) == 0) || ((generics.tail[1].field_0x1c & 1) != 0)) ||
          ((name.end._7_1_ & 1) != 0)) ||
         ((contextType != (TypeBase *)0x0 && ((contextType->isGeneric & 1U) != 0)))) {
        if (local_1e0->importModule->lexStreamSize <= *(uint *)(functionName.end + 0x6c)) {
          __assert_fail("function.genericOffsetStart < data->importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x3364,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        local_1e0->delayedDefinition =
             local_1e0->importModule->lexStream + *(uint *)(functionName.end + 0x6c);
        argTypes.tail = (TypeHandle *)ctx->typeAuto;
        if (*(int *)(functionName.end + 0x74) != -1) {
          argTypes.tail =
               (TypeHandle *)
               GetImportedModuleTypeAt(ctx,source,moduleCtx,*(uint *)(functionName.end + 0x74));
        }
        if (argTypes.tail == (TypeHandle *)0x0) {
          anon_unknown.dwarf_e7629::Stop
                    (ctx,source,
                     "ERROR: can\'t find generic function \'%s\' return type in module %.*s",
                     pcVar12 + *(uint *)functionName.end,
                     (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                  (int)(moduleCtx->data->name).begin));
        }
        IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)auStack_348);
        for (argument_1._4_4_ = 0; argument_1._4_4_ < *(uint *)(functionName.end + 0x54);
            argument_1._4_4_ = argument_1._4_4_ + 1) {
          local_358 = pEVar15 + (*(int *)(functionName.end + 0x50) + argument_1._4_4_);
          this_02 = ExpressionContext::get<TypeHandle>(ctx);
          if (local_358->type == 0xffffffff) {
            local_5b0 = ctx->typeGeneric;
          }
          else {
            local_5b0 = GetImportedModuleTypeAt(ctx,source,moduleCtx,local_358->type);
          }
          TypeHandle::TypeHandle(this_02,local_5b0);
          IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)auStack_348,this_02);
        }
        typeClass_1 = _auStack_348;
        pTStack_360 = argTypes.head;
        arguments.tail = argTypes.head;
        arguments.head = (TypeHandle *)_auStack_348;
        pTVar23 = ExpressionContext::GetFunctionType(ctx,source,(TypeBase *)argTypes.tail,arguments)
        ;
        local_1e0->type = pTVar23;
      }
      if (local_1e0->type == (TypeFunction *)0x0) {
        __assert_fail("data->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x337c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
      if ((local_1e0->isPrototype & 1U) == 0) {
        if ((local_1e0->isHidden & 1U) != 0) {
          ExpressionContext::HideFunction(ctx,local_1e0);
        }
      }
      else {
        ExpressionContext::HideFunction(ctx,local_1e0);
      }
      if (contextType != (TypeBase *)0x0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
      if (pNStack_170 != (NamespaceData *)0x0) {
        ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
      }
      bVar9 = InplaceStr::operator==((InplaceStr *)&functionType,(InplaceStr *)local_a0);
      if ((bVar9) &&
         (uVar27 = SmallArray<ArgumentData,_4U>::size(&local_1e0->arguments), uVar27 == 2)) {
        pAVar24 = SmallArray<ArgumentData,_4U>::operator[](&local_1e0->arguments,1);
        pTStack_370 = getType<TypeClass>(pAVar24->type);
        if (pTStack_370 != (TypeClass *)0x0) {
          pTStack_370->defaultAssign = local_1e0;
        }
      }
    }
    else if ((*(prototype->name->name).begin == '$') || ((prototype->isGenericInstance & 1U) != 0))
    {
      SmallArray<FunctionData_*,_128U>::push_back(&ctx->functions,&prototype);
    }
    else {
      pcVar3 = (prototype->name->name).begin;
      pcVar4 = (prototype->type->super_TypeBase).name.begin;
      pcVar5 = (moduleCtx->data->name).begin;
      in_stack_fffffffffffff990 =
           (TypeFunction *)
           CONCAT44((int)((ulong)in_stack_fffffffffffff990 >> 0x20),
                    *(int *)&(moduleCtx->data->name).end - (int)pcVar5);
      anon_unknown.dwarf_e7629::Stop
                (ctx,source,
                 "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s",
                 (ulong)(uint)(*(int *)&(prototype->name->name).end - (int)pcVar3),pcVar3,
                 (ulong)(uint)(*(int *)&(prototype->type->super_TypeBase).name.end - (int)pcVar4),
                 pcVar4,in_stack_fffffffffffff990,pcVar5);
    }
    function._4_4_ = function._4_4_ + 1;
  } while( true );
}

Assistant:

void ImportModuleFunctions(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleFunctions");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternVarInfo *explicitTypeInfo = FindFirstVar(bCode) + bCode->variableCount;

	moduleCtx.data->importedFunctionCount = bCode->moduleFunctionCount;

	// Import functions
	ExternFuncInfo *functionList = FindFirstFunc(bCode);
	ExternLocalInfo *localList = FindFirstLocal(bCode);

	unsigned currCount = ctx.functions.size();

	InplaceStr defaultAssignName = InplaceStr("default_assign$_");

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		InplaceStr functionName = InplaceStr(symbols + function.offsetToName);

		TypeBase *functionType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.funcType);

		if(!functionType)
			Stop(ctx, source, "ERROR: can't find function '%s' type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

		// Import function explicit type list
		IntrusiveList<MatchData> generics;

		bool hasGenericExplicitType = false;

		for(unsigned k = 0; k < function.explicitTypeCount; k++)
		{
			InplaceStr name = InplaceStr(symbols + explicitTypeInfo[k].offsetToName);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			TypeBase *type = explicitTypeInfo[k].type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, explicitTypeInfo[k].type);

			if(!type)
				Stop(ctx, source, "ERROR: can't find function '%s' explicit type '%d' in module %.*s", symbols + function.offsetToName, k, FMT_ISTR(moduleCtx.data->name));

			if(type->isGeneric)
				hasGenericExplicitType = true;

			generics.push_back(new (ctx.get<MatchData>()) MatchData(nameIdentifier, type));
		}

		explicitTypeInfo += function.explicitTypeCount;

		FunctionData *prev = NULL;
		FunctionData *prototype = NULL;

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, function.nameHash); chain; chain = chain.next())
		{
			if(chain->isPrototype)
			{
				prototype = *chain;
				continue;
			}

			if(chain->type == functionType)
			{
				bool explicitTypeMatch = true;

				for(unsigned k = 0; k < function.explicitTypeCount; k++)
				{
					TypeBase *prevType = chain->generics[k]->type;
					TypeBase *type = generics[k]->type;

					if(&prevType != &type)
						explicitTypeMatch = false;
				}

				if(explicitTypeMatch)
				{
					prev = *chain;
					break;
				}
			}
		}

		if(prev)
		{
			if(*prev->name->name.begin == '$' || prev->isGenericInstance)
				ctx.functions.push_back(prev);
			else
				Stop(ctx, source, "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s", FMT_ISTR(prev->name->name), FMT_ISTR(prev->type->name), FMT_ISTR(moduleCtx.data->name));

			continue;
		}

		NamespaceData *parentNamespace = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->fullNameHash == function.namespaceHash)
			{
				parentNamespace = ctx.namespaces[k];
				break;
			}
		}

		if(parentNamespace)
			ctx.PushScope(parentNamespace);

		TypeBase *parentType = NULL;

		if(function.parentType != ~0u)
		{
			parentType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.parentType);

			if(!parentType)
				Stop(ctx, source, "ERROR: can't find function '%s' parent type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		TypeBase *contextType = NULL;

		if(function.contextType != ~0u)
		{
			contextType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.contextType);

			if(!contextType)
				Stop(ctx, source, "ERROR: can't find function '%s' context type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		if(!contextType)
			contextType = ctx.GetReferenceType(parentType ? parentType : ctx.typeVoid);

		bool coroutine = function.funcCat == ExternFuncInfo::COROUTINE;
		bool accessor = *(functionName.end - 1) == '$';
		bool isOperator = function.isOperator != 0;

		if(parentType)
			ctx.PushScope(parentType);

		ModuleData *importModule = moduleCtx.data;

		if(function.definitionModule != 0)
			importModule = moduleCtx.dependencies[function.definitionModule - 1];

		assert(function.definitionLocationStart < importModule->lexStreamSize);
		assert(function.definitionLocationEnd < importModule->lexStreamSize);

		SynBase *locationSource = function.definitionLocationStart != 0 || function.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(function.definitionLocationStart + importModule->lexStream, function.definitionLocationEnd + importModule->lexStream) : source;

		assert(function.definitionLocationName < importModule->lexStreamSize);

		Lexeme *locationName = function.definitionLocationName + importModule->lexStream;

		SynIdentifier *identifier = function.definitionLocationName != 0 ? new (ctx.get<SynIdentifier>()) SynIdentifier(locationName, locationName, functionName) : new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *data = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, locationSource, ctx.scope, coroutine, accessor, isOperator, getType<TypeFunction>(functionType), contextType, identifier, generics, ctx.uniqueFunctionId++);

		data->importModule = importModule;

		data->isPrototype = (function.regVmCodeSize & 0x80000000) != 0;

		assert(data->isPrototype == ((function.regVmCodeSize & 0x80000000) != 0));

		if(prototype)
			prototype->implementation = data;

		// TODO: find function proto
		data->isGenericInstance = !!function.isGenericInstance;

		if(data->name->name == InplaceStr("__newS") || data->name->name == InplaceStr("__newA") || data->name->name == InplaceStr("__closeUpvalue"))
			data->isInternal = true;

		if(function.funcCat == ExternFuncInfo::LOCAL)
			data->isHidden = true;

		data->attributes = function.attributes;

		ctx.AddFunction(data);

		ctx.PushScope(data);

		data->functionScope = ctx.scope;

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			bool isExplicit = (argument.paramFlags & ExternLocalInfo::IS_EXPLICIT) != 0;

			TypeBase *argType = argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type);

			if(!argType)
				Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			InplaceStr argName = InplaceStr(symbols + argument.offsetToName);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(argName);

			data->arguments.push_back(ArgumentData(source, isExplicit, argNameIdentifier, argType, NULL));

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, argType);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, argType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);
		}

		assert(contextType);

		if(parentType)
		{
			TypeBase *type = ctx.GetReferenceType(parentType);

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);

			// Register type method
			if(TypeClass *typeClass = getType<TypeClass>(parentType))
			{
				if(const char *pos = strstr(data->name->name.begin, "::"))
				{
					typeClass->methods.push_back(data);
					typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), data);
				}
			}
		}
		else if(contextType)
		{
			unsigned offset = AllocateArgumentInScope(ctx, source, 0, contextType);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$context"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, contextType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, false);
		}

		data->argumentsSize = data->functionScope->dataSize;

		// TODO: explicit flag
		if(function.funcType == 0 || functionType->isGeneric || hasGenericExplicitType || (parentType && parentType->isGeneric))
		{
			assert(function.genericOffsetStart < data->importModule->lexStreamSize);

			data->delayedDefinition = function.genericOffsetStart + data->importModule->lexStream;

			TypeBase *returnType = ctx.typeAuto;

			if(function.genericReturnType != ~0u)
				returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.genericReturnType);

			if(!returnType)
				Stop(ctx, source, "ERROR: can't find generic function '%s' return type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			IntrusiveList<TypeHandle> argTypes;

			for(unsigned n = 0; n < function.paramCount; n++)
			{
				ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

				argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type)));
			}

			data->type = ctx.GetFunctionType(source, returnType, argTypes);
		}

		assert(data->type);

		ctx.PopScope(SCOPE_FUNCTION);

		if(data->isPrototype)
			ctx.HideFunction(data);
		else if(data->isHidden)
			ctx.HideFunction(data);

		if(parentType)
			ctx.PopScope(SCOPE_TYPE);

		if(parentNamespace)
			ctx.PopScope(SCOPE_NAMESPACE);

		if(functionName == defaultAssignName && data->arguments.size() == 2)
		{
			if(TypeClass *typeClass = getType<TypeClass>(data->arguments[1].type))
				typeClass->defaultAssign = data;
		}
	}

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		FunctionData *data = ctx.functions[currCount + i];

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			if(argument.defaultFuncId != 0xffff)
			{
				FunctionData *target = ctx.functions[currCount + argument.defaultFuncId - bCode->moduleFunctionCount];

				ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, target->type, target, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, target->contextType));

				data->arguments[n].value = new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, target->type->returnType, access, IntrusiveList<ExprBase>());
			}
		}
	}
}